

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  int iVar1;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  TValue *top;
  int32_t nres;
  void *cf;
  TValue *frame;
  lua_State *in_stack_ffffffffffffffb8;
  void *local_30;
  ulong local_28;
  
  local_28 = *(long *)((long)in_RDI + 0x10) - 8;
  local_30 = *(void **)((long)in_RDI + 0x30);
switchD_00108568_default:
  if (local_30 == (void *)0x0) {
LAB_001087ee:
    if (in_EDX != 0) {
      *(undefined8 *)((long)in_RDI + 0x30) = 0;
      *(ulong *)((long)in_RDI + 0x10) = (ulong)*(uint *)((long)in_RDI + 0x24) + 8;
      unwindstack(in_stack_ffffffffffffffb8,(TValue *)0x10882c);
      if (*(long *)((ulong)*(uint *)((long)in_RDI + 8) + 0xe0) != 0) {
        (**(code **)((ulong)*(uint *)((long)in_RDI + 8) + 0xe0))(in_RDI);
      }
      exit(1);
    }
    return in_RDI;
  }
  iVar1 = *(int *)(((ulong)local_30 & 0xfffffffffffffffc) + 0x10);
  if ((iVar1 < 0) && (local_28 < (ulong)*(uint *)((long)in_RDI + 0x24) + (long)-iVar1)) {
    if (in_EDX != 0) {
      *(undefined8 *)((long)in_RDI + 0x30) = *(undefined8 *)((long)local_30 + 0x20);
      *(ulong *)((long)in_RDI + 0x10) = local_28 + 8;
      unwindstack(in_stack_ffffffffffffffb8,(TValue *)0x108514);
    }
    return local_30;
  }
  if (local_28 <= *(uint *)((long)in_RDI + 0x24)) goto LAB_001087ee;
  in_stack_ffffffffffffffb8 = (lua_State *)(ulong)(*(uint *)(local_28 + 4) & 7);
  switch(in_stack_ffffffffffffffb8) {
  case (lua_State *)0x0:
  case (lua_State *)0x4:
    local_28 = local_28 +
               (ulong)((*(uint *)((ulong)*(uint *)(local_28 + 4) - 4) >> 8 & 0xff) + 1) * -8;
    goto switchD_00108568_default;
  case (lua_State *)0x1:
    break;
  case (lua_State *)0x2:
    if (*(int *)(local_28 - 8) != 1) goto switchD_00108568_caseD_3;
    break;
  case (lua_State *)0x3:
switchD_00108568_caseD_3:
    local_28 = local_28 - (long)(int)(*(uint *)(local_28 + 4) & 0xfffffff8);
    goto switchD_00108568_default;
  case (lua_State *)0x5:
    goto switchD_00108568_caseD_5;
  case (lua_State *)0x6:
  case (lua_State *)0x7:
    if (in_EDX != 0) {
      if (in_EDX == 1) {
        local_28 = local_28 - (long)(int)(*(uint *)(local_28 + 4) & 0xfffffff8);
        goto switchD_00108568_default;
      }
      if ((*(uint *)(local_28 + 4) & 7) == 6) {
        *(byte *)((ulong)*(uint *)((long)in_RDI + 8) + 0x91) =
             *(byte *)((ulong)*(uint *)((long)in_RDI + 8) + 0x91) & 0xef;
      }
      *(void **)((long)in_RDI + 0x30) = local_30;
      *(ulong *)((long)in_RDI + 0x10) =
           (local_28 - (long)(int)(*(uint *)(local_28 + 4) & 0xfffffff8)) + 8;
      unwindstack(in_stack_ffffffffffffffb8,(TValue *)0x1087d9);
    }
    return (void *)((ulong)local_30 | 2);
  default:
    goto switchD_00108568_default;
  }
  if (in_EDX == 0) {
    if (local_30 != in_RSI) {
      local_30 = *(void **)((long)local_30 + 0x20);
      local_28 = local_28 - (long)(int)(*(uint *)(local_28 + 4) & 0xfffffff8);
      goto switchD_00108568_default;
    }
  }
  else {
    *(undefined8 *)((long)in_RDI + 0x30) = *(undefined8 *)((long)local_30 + 0x20);
    *(ulong *)((long)in_RDI + 0x10) =
         (local_28 - (long)(int)(*(uint *)(local_28 + 4) & 0xfffffff8)) + 8;
    unwindstack(in_stack_ffffffffffffffb8,(TValue *)0x1085f2);
  }
  return (void *)0x0;
switchD_00108568_caseD_5:
  if (((ulong)local_30 & 1) == 0) {
    if (in_EDX != 0) {
      *(undefined8 *)((long)in_RDI + 0x30) = *(undefined8 *)((long)local_30 + 0x20);
      *(ulong *)((long)in_RDI + 0x10) =
           (local_28 - (long)(int)(*(uint *)(local_28 + 4) & 0xfffffff8)) + 8;
      unwindstack(in_stack_ffffffffffffffb8,(TValue *)0x1086eb);
    }
  }
  else if (in_EDX != 0) {
    *(byte *)((ulong)*(uint *)((long)in_RDI + 8) + 0x91) =
         *(byte *)((ulong)*(uint *)((long)in_RDI + 8) + 0x91) & 0xef;
    *(undefined8 *)((long)in_RDI + 0x30) = 0;
    *(char *)((long)in_RDI + 7) = (char)in_EDX;
  }
  return local_30;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->cframe = cframe_prev(cf);
	  L->base = frame+1;
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack))
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
#if LJ_HASFFI
    unwind_c:
#endif
#if LJ_UNWIND_EXT
      if (errcode) {
	L->cframe = cframe_prev(cf);
	L->base = frame_prevd(frame) + 1;
	unwindstack(L, frame);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->cframe = cframe_prev(cf);
	L->base = frame_prevd(frame) + 1;
	unwindstack(L, frame);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
#if LJ_HASFFI
      if ((frame-1)->u32.lo == LJ_CONT_FFI_CALLBACK)
	goto unwind_c;
#endif
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(G(L));
	L->cframe = cf;
	L->base = frame_prevd(frame) + 1;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->cframe = NULL;
    L->base = tvref(L->stack)+1;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}